

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCLoader.cpp
# Opt level: O0

void anon_unknown.dwarf_a1d406::ProcessSpatialStructures(ConversionData *conv)

{
  _Base_ptr p_Var1;
  DB *this;
  set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>
  *psVar2;
  bool bVar3;
  ObjectMapByType *pOVar4;
  pointer ppVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  _Base_ptr this_00;
  reference ppVar7;
  LazyObject *this_01;
  IfcRelAggregates *pIVar8;
  undefined1 *this_02;
  Lazy *this_03;
  uint64_t uVar9;
  uint64_t uVar10;
  reference ppLVar11;
  reference ppaVar12;
  aiNode *this_04;
  void *pvVar13;
  pair<std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  pVar14;
  allocator<char> local_471;
  string local_470;
  value_type local_450;
  aiNode *node;
  size_t i;
  string local_438;
  aiNode *local_418;
  IfcSpatialStructureElement *local_410;
  IfcSpatialStructureElement *prod_1;
  LazyObject *lz_1;
  iterator __end2;
  iterator __begin2;
  ObjectSet *__range2;
  size_t nb_nodes;
  IfcObjectDefinition *local_3d8;
  IfcObjectDefinition *def;
  const_iterator __end4;
  const_iterator __begin4;
  ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcObjectDefinition>,_1UL,_0UL> *__range4;
  IfcRelAggregates *aggr;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_> local_3a8;
  RefMapRange ref_range;
  RefMap *refs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  byte local_362;
  allocator<char> local_361;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  format local_2e0;
  IfcSpatialStructureElement *local_168;
  IfcSpatialStructureElement *prod;
  LazyObject *lz;
  iterator __end1;
  iterator __begin1;
  ObjectSet *__range1;
  vector<aiNode_*,_std::allocator<aiNode_*>_> nodes;
  string local_120;
  allocator<char> local_f9;
  key_type local_f8;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>
  local_d8;
  _Self local_d0;
  allocator<char> local_c1;
  key_type local_c0;
  _Self local_a0;
  allocator<char> local_91;
  key_type local_90;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>
  local_70;
  set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>
  *local_68;
  ObjectSet *range;
  allocator<char> local_41;
  key_type local_40;
  _Self local_20;
  ObjectMapByType *local_18;
  ObjectMapByType *map;
  ConversionData *conv_local;
  
  map = (ObjectMapByType *)conv;
  pOVar4 = Assimp::STEP::DB::GetObjectsByType_abi_cxx11_(conv->db);
  local_18 = pOVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"ifcsite",&local_41);
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>_>
       ::find(pOVar4,&local_40);
  range = (ObjectSet *)
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>_>
          ::end(local_18);
  bVar3 = std::operator!=(&local_20,(_Self *)&range);
  if (!bVar3) {
    __assert_fail("map.find(\"ifcsite\") != map.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Importer/IFC/IFCLoader.cpp"
                  ,0x374,"void (anonymous namespace)::ProcessSpatialStructures(ConversionData &)");
  }
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  pOVar4 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"ifcsite",&local_91);
  local_70._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>_>
       ::find(pOVar4,&local_90);
  ppVar5 = std::
           _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>
           ::operator->(&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  local_68 = &ppVar5->second;
  bVar3 = std::
          set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>
          ::empty(&ppVar5->second);
  pOVar4 = local_18;
  if (bVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"ifcbuilding",&local_c1);
    local_a0._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>_>
         ::find(pOVar4,&local_c0);
    local_d0._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>_>
         ::end(local_18);
    bVar3 = std::operator!=(&local_a0,&local_d0);
    if (!bVar3) {
      __assert_fail("map.find(\"ifcbuilding\") != map.end()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Importer/IFC/IFCLoader.cpp"
                    ,0x378,"void (anonymous namespace)::ProcessSpatialStructures(ConversionData &)")
      ;
    }
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator(&local_c1);
    pOVar4 = local_18;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"ifcbuilding",&local_f9);
    local_d8._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>_>
         ::find(pOVar4,&local_f8);
    ppVar5 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>
             ::operator->(&local_d8);
    local_68 = &ppVar5->second;
    std::__cxx11::string::~string((string *)&local_f8);
    std::allocator<char>::~allocator(&local_f9);
    bVar3 = std::
            set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>
            ::empty(local_68);
    if (bVar3) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_120,
                 "no root element found (expected IfcBuilding or preferably IfcSite)",
                 (allocator<char> *)
                 ((long)&nodes.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 7));
      Assimp::LogFunctions<Assimp::IFCImporter>::ThrowException(&local_120);
      std::__cxx11::string::~string((string *)&local_120);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&nodes.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 7));
    }
  }
  std::vector<aiNode_*,_std::allocator<aiNode_*>_>::vector
            ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)&__range1);
  psVar2 = local_68;
  __end1 = std::
           set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>
           ::begin(local_68);
  lz = (LazyObject *)
       std::
       set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>
       ::end(psVar2);
  while (bVar3 = std::operator!=(&__end1,(_Self *)&lz), bVar3) {
    ppLVar11 = std::_Rb_tree_const_iterator<const_Assimp::STEP::LazyObject_*>::operator*(&__end1);
    prod = (IfcSpatialStructureElement *)*ppLVar11;
    local_168 = Assimp::STEP::LazyObject::ToPtr<Assimp::IFC::Schema_2x3::IfcSpatialStructureElement>
                          ((LazyObject *)prod);
    if (local_168 != (IfcSpatialStructureElement *)0x0) {
      bVar3 = Assimp::STEP::Maybe::operator_cast_to_bool
                        ((Maybe *)&(local_168->super_IfcProduct).super_IfcObject.field_0x38);
      local_362 = 0;
      if (bVar3) {
        pbVar6 = Assimp::STEP::
                 Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::Get((Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&(local_168->super_IfcProduct).super_IfcObject.field_0x38);
        std::__cxx11::string::string((string *)&local_360,(string *)pbVar6);
      }
      else {
        std::allocator<char>::allocator();
        local_362 = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_360,"unnamed",&local_361);
      }
      std::operator+(&local_340,"looking at spatial structure `",&local_360);
      std::operator+(&local_320,&local_340,"`");
      bVar3 = Assimp::STEP::Maybe::operator_cast_to_bool
                        ((Maybe *)&(local_168->super_IfcProduct).super_IfcObject.
                                   super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.
                                   field_0x10);
      refs._6_1_ = 0;
      if (bVar3) {
        pbVar6 = Assimp::STEP::
                 Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::Get((Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&(local_168->super_IfcProduct).super_IfcObject.
                           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.field_0x10);
        std::operator+(&local_388," which is of type ",pbVar6);
      }
      else {
        std::allocator<char>::allocator();
        refs._6_1_ = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_388,"",(allocator<char> *)((long)&refs + 7));
      }
      std::operator+(&local_300,&local_320,&local_388);
      Assimp::Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
      basic_formatter<std::__cxx11::string>
                ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)&local_2e0,
                 &local_300);
      Assimp::LogFunctions<Assimp::IFCImporter>::LogDebug(&local_2e0);
      Assimp::Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      ~basic_formatter(&local_2e0);
      std::__cxx11::string::~string((string *)&local_300);
      std::__cxx11::string::~string((string *)&local_388);
      if ((refs._6_1_ & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)((long)&refs + 7));
      }
      std::__cxx11::string::~string((string *)&local_320);
      std::__cxx11::string::~string((string *)&local_340);
      std::__cxx11::string::~string((string *)&local_360);
      if ((local_362 & 1) != 0) {
        std::allocator<char>::~allocator(&local_361);
      }
      this_00 = (_Base_ptr)
                Assimp::STEP::DB::GetRefs
                          ((DB *)(map->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left);
      p_Var1 = (map->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right;
      ref_range.second._M_node = this_00;
      aggr = (IfcRelAggregates *)
             Assimp::STEP::Object::GetID
                       ((Object *)((long)&p_Var1->_M_color + *(long *)(*(long *)p_Var1 + -0x18)));
      pVar14 = std::
               multimap<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
               ::equal_range((multimap<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                              *)this_00,(key_type_conflict1 *)&aggr);
      while( true ) {
        ref_range.first = pVar14.second._M_node;
        local_3a8 = pVar14.first._M_node;
        bVar3 = std::operator!=(&local_3a8,&ref_range.first);
        if (!bVar3) break;
        this = (DB *)(map->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        ppVar7 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>::
                 operator*(&local_3a8);
        this_01 = Assimp::STEP::DB::GetObject(this,ppVar7->second);
        pIVar8 = Assimp::STEP::LazyObject::ToPtr<Assimp::IFC::Schema_2x3::IfcRelAggregates>(this_01)
        ;
        if (pIVar8 != (IfcRelAggregates *)0x0) {
          this_02 = &(pIVar8->super_IfcRelDecomposes).
                     super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelDecomposes,_2UL>.field_0x18;
          __end4 = std::
                   vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcObjectDefinition>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcObjectDefinition>_>_>
                   ::begin((vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcObjectDefinition>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcObjectDefinition>_>_>
                            *)this_02);
          def = (IfcObjectDefinition *)
                std::
                vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcObjectDefinition>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcObjectDefinition>_>_>
                ::end((vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcObjectDefinition>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcObjectDefinition>_>_>
                       *)this_02);
          while (bVar3 = __gnu_cxx::operator!=
                                   (&__end4,(__normal_iterator<const_Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcObjectDefinition>_*,_std::vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcObjectDefinition>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcObjectDefinition>_>_>_>
                                             *)&def), bVar3) {
            this_03 = (Lazy *)__gnu_cxx::
                              __normal_iterator<const_Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcObjectDefinition>_*,_std::vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcObjectDefinition>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcObjectDefinition>_>_>_>
                              ::operator*(&__end4);
            local_3d8 = Assimp::STEP::Lazy::operator_cast_to_IfcObjectDefinition_(this_03);
            uVar9 = Assimp::STEP::Object::GetID
                              ((Object *)
                               ((long)&(local_3d8->super_IfcRoot).
                                       super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>.
                                       _vptr_ObjectHelper +
                               (long)(local_3d8->super_IfcRoot).
                                     super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>.
                                     _vptr_ObjectHelper[-3]));
            uVar10 = Assimp::STEP::Object::GetID
                               ((Object *)
                                (&(local_168->super_IfcProduct).super_IfcObject.field_0x0 +
                                *(long *)(*(long *)&(local_168->super_IfcProduct).super_IfcObject +
                                         -0x18)));
            if (uVar9 == uVar10) {
              Assimp::LogFunctions<Assimp::IFCImporter>::LogDebug
                        ("selecting this spatial structure as root structure");
              nb_nodes = (size_t)ProcessSpatialStructure
                                           ((aiNode *)0x0,&local_168->super_IfcProduct,
                                            (ConversionData *)map,
                                            (vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                                             *)0x0);
              std::vector<aiNode_*,_std::allocator<aiNode_*>_>::push_back
                        ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)&__range1,
                         (value_type *)&nb_nodes);
            }
            __gnu_cxx::
            __normal_iterator<const_Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcObjectDefinition>_*,_std::vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcObjectDefinition>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcObjectDefinition>_>_>_>
            ::operator++(&__end4);
          }
        }
        std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>::operator++
                  (&local_3a8);
        pVar14.second._M_node = ref_range.first._M_node;
        pVar14.first._M_node = local_3a8._M_node;
      }
    }
    std::_Rb_tree_const_iterator<const_Assimp::STEP::LazyObject_*>::operator++(&__end1);
  }
  __range2 = (ObjectSet *)
             std::vector<aiNode_*,_std::allocator<aiNode_*>_>::size
                       ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)&__range1);
  if (__range2 == (ObjectSet *)0x0) {
    Assimp::LogFunctions<Assimp::IFCImporter>::LogWarn
              ("failed to determine primary site element, taking all the IfcSite");
    psVar2 = local_68;
    __end2 = std::
             set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>
             ::begin(local_68);
    lz_1 = (LazyObject *)
           std::
           set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>
           ::end(psVar2);
    while (bVar3 = std::operator!=(&__end2,(_Self *)&lz_1), bVar3) {
      ppLVar11 = std::_Rb_tree_const_iterator<const_Assimp::STEP::LazyObject_*>::operator*(&__end2);
      prod_1 = (IfcSpatialStructureElement *)*ppLVar11;
      local_410 = Assimp::STEP::LazyObject::
                  ToPtr<Assimp::IFC::Schema_2x3::IfcSpatialStructureElement>((LazyObject *)prod_1);
      if (local_410 != (IfcSpatialStructureElement *)0x0) {
        local_418 = ProcessSpatialStructure
                              ((aiNode *)0x0,&local_410->super_IfcProduct,(ConversionData *)map,
                               (vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                                *)0x0);
        std::vector<aiNode_*,_std::allocator<aiNode_*>_>::push_back
                  ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)&__range1,&local_418);
      }
      std::_Rb_tree_const_iterator<const_Assimp::STEP::LazyObject_*>::operator++(&__end2);
    }
    __range2 = (ObjectSet *)
               std::vector<aiNode_*,_std::allocator<aiNode_*>_>::size
                         ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)&__range1);
  }
  if (__range2 == (ObjectSet *)0x1) {
    ppaVar12 = std::vector<aiNode_*,_std::allocator<aiNode_*>_>::operator[]
                         ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)&__range1,0);
    *(value_type *)((map->_M_t)._M_impl.super__Rb_tree_header._M_node_count + 8) = *ppaVar12;
  }
  else if (__range2 < (ObjectSet *)0x2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_470,"failed to determine primary site element",&local_471);
    Assimp::LogFunctions<Assimp::IFCImporter>::ThrowException(&local_470);
    std::__cxx11::string::~string((string *)&local_470);
    std::allocator<char>::~allocator(&local_471);
  }
  else {
    this_04 = (aiNode *)operator_new(0x478);
    i._6_1_ = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_438,"Root",(allocator<char> *)((long)&i + 7));
    aiNode::aiNode(this_04,&local_438);
    i._6_1_ = 0;
    *(aiNode **)((map->_M_t)._M_impl.super__Rb_tree_header._M_node_count + 8) = this_04;
    std::__cxx11::string::~string((string *)&local_438);
    std::allocator<char>::~allocator((allocator<char> *)((long)&i + 7));
    *(undefined8 *)(*(long *)((map->_M_t)._M_impl.super__Rb_tree_header._M_node_count + 8) + 0x448)
         = 0;
    *(undefined4 *)(*(long *)((map->_M_t)._M_impl.super__Rb_tree_header._M_node_count + 8) + 0x450)
         = __range2._0_4_;
    pvVar13 = operator_new__((ulong)*(uint *)(*(long *)((map->_M_t)._M_impl.super__Rb_tree_header.
                                                        _M_node_count + 8) + 0x450) << 3);
    *(void **)(*(long *)((map->_M_t)._M_impl.super__Rb_tree_header._M_node_count + 8) + 0x458) =
         pvVar13;
    for (node = (aiNode *)0x0; node < __range2; node = (aiNode *)((long)&(node->mName).length + 1))
    {
      ppaVar12 = std::vector<aiNode_*,_std::allocator<aiNode_*>_>::operator[]
                           ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)&__range1,(size_type)node
                           );
      local_450 = *ppaVar12;
      local_450->mParent = *(aiNode **)((map->_M_t)._M_impl.super__Rb_tree_header._M_node_count + 8)
      ;
      *(value_type *)
       (*(long *)(*(long *)((map->_M_t)._M_impl.super__Rb_tree_header._M_node_count + 8) + 0x458) +
       (long)node * 8) = local_450;
    }
  }
  std::vector<aiNode_*,_std::allocator<aiNode_*>_>::~vector
            ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)&__range1);
  return;
}

Assistant:

void ProcessSpatialStructures(ConversionData& conv)
{
    // XXX add support for multiple sites (i.e. IfcSpatialStructureElements with composition == COMPLEX)


    // process all products in the file. it is reasonable to assume that a
    // file that is relevant for us contains at least a site or a building.
    const STEP::DB::ObjectMapByType& map = conv.db.GetObjectsByType();

    ai_assert(map.find("ifcsite") != map.end());
    const STEP::DB::ObjectSet* range = &map.find("ifcsite")->second;

    if (range->empty()) {
        ai_assert(map.find("ifcbuilding") != map.end());
        range = &map.find("ifcbuilding")->second;
        if (range->empty()) {
            // no site, no building -  fail;
            IFCImporter::ThrowException("no root element found (expected IfcBuilding or preferably IfcSite)");
        }
    }

	std::vector<aiNode*> nodes;

    for(const STEP::LazyObject* lz : *range) {
        const Schema_2x3::IfcSpatialStructureElement* const prod = lz->ToPtr<Schema_2x3::IfcSpatialStructureElement>();
        if(!prod) {
            continue;
        }
        IFCImporter::LogDebug("looking at spatial structure `" + (prod->Name ? prod->Name.Get() : "unnamed") + "`" + (prod->ObjectType? " which is of type " + prod->ObjectType.Get():""));

        // the primary sites are referenced by an IFCRELAGGREGATES element which assigns them to the IFCPRODUCT
        const STEP::DB::RefMap& refs = conv.db.GetRefs();
        STEP::DB::RefMapRange ref_range = refs.equal_range(conv.proj.GetID());
        for(; ref_range.first != ref_range.second; ++ref_range.first) {
            if(const Schema_2x3::IfcRelAggregates* const aggr = conv.db.GetObject((*ref_range.first).second)->ToPtr<Schema_2x3::IfcRelAggregates>()) {

                for(const Schema_2x3::IfcObjectDefinition& def : aggr->RelatedObjects) {
                    // comparing pointer values is not sufficient, we would need to cast them to the same type first
                    // as there is multiple inheritance in the game.
                    if (def.GetID() == prod->GetID()) {
                        IFCImporter::LogDebug("selecting this spatial structure as root structure");
                        // got it, this is one primary site.
						nodes.push_back(ProcessSpatialStructure(NULL, *prod, conv, NULL));
                    }
                }
            }
        }
    }

	size_t nb_nodes = nodes.size();

	if (nb_nodes == 0) {
		IFCImporter::LogWarn("failed to determine primary site element, taking all the IfcSite");
		for (const STEP::LazyObject* lz : *range) {
			const Schema_2x3::IfcSpatialStructureElement* const prod = lz->ToPtr<Schema_2x3::IfcSpatialStructureElement>();
			if (!prod) {
				continue;
			}

			nodes.push_back(ProcessSpatialStructure(NULL, *prod, conv, NULL));
		}

		nb_nodes = nodes.size();
	}

	if (nb_nodes == 1) {
		conv.out->mRootNode = nodes[0];
	}
	else if (nb_nodes > 1) {
		conv.out->mRootNode = new aiNode("Root");
		conv.out->mRootNode->mParent = NULL;
		conv.out->mRootNode->mNumChildren = static_cast<unsigned int>(nb_nodes);
		conv.out->mRootNode->mChildren = new aiNode*[conv.out->mRootNode->mNumChildren];

		for (size_t i = 0; i < nb_nodes; ++i) {
			aiNode* node = nodes[i];

			node->mParent = conv.out->mRootNode;

			conv.out->mRootNode->mChildren[i] = node;
		}
	}
	else {
		IFCImporter::ThrowException("failed to determine primary site element");
	}
}